

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apinames.cpp
# Opt level: O2

int test_c(void)

{
  _Alloc_hider _Var1;
  bool bVar2;
  char cVar3;
  uint uVar4;
  RtMidiApi RVar5;
  char *pcVar7;
  ostream *poVar8;
  ulong __n;
  size_t j;
  ulong uVar9;
  ulong uVar10;
  allocator<char> local_89;
  string name;
  vector<RtMidiApi,_std::allocator<RtMidiApi>_> apis;
  string displayName;
  int iVar6;
  
  uVar4 = rtmidi_get_compiled_api(0,0);
  __n = (ulong)uVar4;
  std::vector<RtMidiApi,_std::allocator<RtMidiApi>_>::vector(&apis,__n,(allocator_type *)&name);
  rtmidi_get_compiled_api
            (apis.super__Vector_base<RtMidiApi,_std::allocator<RtMidiApi>_>._M_impl.
             super__Vector_impl_data._M_start,uVar4);
  std::operator<<((ostream *)&std::cout,"API names by identifier (C):\n");
  for (uVar9 = 0; __n != uVar9; uVar9 = uVar9 + 1) {
    pcVar7 = (char *)rtmidi_api_name(apis.super__Vector_base<RtMidiApi,_std::allocator<RtMidiApi>_>.
                                     _M_impl.super__Vector_impl_data._M_start[uVar9]);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&name,pcVar7,(allocator<char> *)&displayName);
    if (name._M_string_length == 0) {
      poVar8 = std::operator<<((ostream *)&std::cout,"Invalid name for API ");
      poVar8 = (ostream *)
               std::ostream::operator<<
                         (poVar8,apis.super__Vector_base<RtMidiApi,_std::allocator<RtMidiApi>_>.
                                 _M_impl.super__Vector_impl_data._M_start[uVar9]);
      std::operator<<(poVar8,"\n");
      goto LAB_00102b2c;
    }
    pcVar7 = (char *)rtmidi_api_display_name
                               (apis.super__Vector_base<RtMidiApi,_std::allocator<RtMidiApi>_>.
                                _M_impl.super__Vector_impl_data._M_start[uVar9]);
    std::__cxx11::string::string<std::allocator<char>>((string *)&displayName,pcVar7,&local_89);
    if (displayName._M_string_length == 0) {
      poVar8 = std::operator<<((ostream *)&std::cout,"Invalid display name for API ");
      poVar8 = (ostream *)
               std::ostream::operator<<
                         (poVar8,apis.super__Vector_base<RtMidiApi,_std::allocator<RtMidiApi>_>.
                                 _M_impl.super__Vector_impl_data._M_start[uVar9]);
      std::operator<<(poVar8,"\n");
      goto LAB_00102b2c;
    }
    poVar8 = std::operator<<((ostream *)&std::cout,"* ");
    poVar8 = (ostream *)
             std::ostream::operator<<
                       (poVar8,apis.super__Vector_base<RtMidiApi,_std::allocator<RtMidiApi>_>.
                               _M_impl.super__Vector_impl_data._M_start[uVar9]);
    poVar8 = std::operator<<(poVar8," \'");
    poVar8 = std::operator<<(poVar8,(string *)&name);
    poVar8 = std::operator<<(poVar8,"\': \'");
    poVar8 = std::operator<<(poVar8,(string *)&displayName);
    std::operator<<(poVar8,"\'\n");
    std::__cxx11::string::~string((string *)&displayName);
    std::__cxx11::string::~string((string *)&name);
  }
  pcVar7 = (char *)rtmidi_api_name(0xffffffffffffffff);
  if (pcVar7 == (char *)0x0) {
    pcVar7 = "";
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&name,pcVar7,(allocator<char> *)&displayName);
  if (name._M_string_length == 0) {
    pcVar7 = (char *)rtmidi_api_display_name(0xffffffffffffffff);
    if (pcVar7 == (char *)0x0) {
      pcVar7 = "";
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&displayName,pcVar7,&local_89);
    bVar2 = std::operator!=(&displayName,"Unknown");
    if (bVar2) {
      poVar8 = std::operator<<((ostream *)&std::cout,"Bad display string for invalid API \'");
      poVar8 = std::operator<<(poVar8,(string *)&displayName);
      std::operator<<(poVar8,"\'\n");
    }
    else {
      std::__cxx11::string::~string((string *)&displayName);
      std::__cxx11::string::~string((string *)&name);
      std::operator<<((ostream *)&std::cout,"API identifiers by name (C):\n");
      for (uVar9 = 0; uVar9 != __n; uVar9 = uVar9 + 1) {
        pcVar7 = (char *)rtmidi_api_name(apis.
                                         super__Vector_base<RtMidiApi,_std::allocator<RtMidiApi>_>.
                                         _M_impl.super__Vector_impl_data._M_start[uVar9]);
        if (pcVar7 == (char *)0x0) {
          pcVar7 = "";
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&name,pcVar7,(allocator<char> *)&displayName);
        RVar5 = rtmidi_compiled_api_by_name(name._M_dataplus._M_p);
        if (RVar5 != apis.super__Vector_base<RtMidiApi,_std::allocator<RtMidiApi>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar9]) {
          poVar8 = std::operator<<((ostream *)&std::cout,"Bad identifier for API \'");
          poVar8 = std::operator<<(poVar8,(string *)&name);
          std::operator<<(poVar8,"\'\n");
          goto LAB_00102b2c;
        }
        poVar8 = std::operator<<((ostream *)&std::cout,"* \'");
        poVar8 = std::operator<<(poVar8,(string *)&name);
        poVar8 = std::operator<<(poVar8,"\': ");
        poVar8 = (ostream *)
                 std::ostream::operator<<
                           (poVar8,apis.super__Vector_base<RtMidiApi,_std::allocator<RtMidiApi>_>.
                                   _M_impl.super__Vector_impl_data._M_start[uVar9]);
        std::operator<<(poVar8,"\n");
        for (uVar10 = 0; _Var1._M_p = name._M_dataplus._M_p, uVar10 < name._M_string_length;
            uVar10 = uVar10 + 1) {
          if ((uVar10 & 1) == 0) {
            iVar6 = tolower((int)name._M_dataplus._M_p[uVar10]);
            cVar3 = (char)iVar6;
          }
          else {
            iVar6 = toupper((int)name._M_dataplus._M_p[uVar10]);
            cVar3 = (char)iVar6;
          }
          _Var1._M_p[uVar10] = cVar3;
        }
        iVar6 = rtmidi_compiled_api_by_name(name._M_dataplus._M_p);
        if (iVar6 != 0) {
          poVar8 = std::operator<<((ostream *)&std::cout,"Identifier ");
          poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar6);
          poVar8 = std::operator<<(poVar8," for invalid API \'");
          poVar8 = std::operator<<(poVar8,(string *)&name);
          std::operator<<(poVar8,"\'\n");
          goto LAB_00102b2c;
        }
        std::__cxx11::string::~string((string *)&name);
      }
      iVar6 = rtmidi_compiled_api_by_name("");
      if (iVar6 == 0) {
        std::_Vector_base<RtMidiApi,_std::allocator<RtMidiApi>_>::~_Vector_base
                  (&apis.super__Vector_base<RtMidiApi,_std::allocator<RtMidiApi>_>);
        return 0;
      }
      std::operator<<((ostream *)&std::cout,"Bad identifier for unknown API name\n");
    }
  }
  else {
    poVar8 = std::operator<<((ostream *)&std::cout,"Bad string for invalid API \'");
    poVar8 = std::operator<<(poVar8,(string *)&name);
    std::operator<<(poVar8,"\'\n");
  }
LAB_00102b2c:
  exit(1);
}

Assistant:

int test_c() {
    unsigned api_count = rtmidi_get_compiled_api(NULL, 0);
    std::vector<RtMidiApi> apis(api_count);
    rtmidi_get_compiled_api(apis.data(), api_count);

    // ensure the known APIs return valid names
    std::cout << "API names by identifier (C):\n";
    for ( size_t i = 0; i < api_count; ++i) {
        const std::string name = rtmidi_api_name(apis[i]);
        if (name.empty()) {
            std::cout << "Invalid name for API " << (int)apis[i] << "\n";
            exit(1);
        }
        const std::string displayName = rtmidi_api_display_name(apis[i]);
        if (displayName.empty()) {
            std::cout << "Invalid display name for API " << (int)apis[i] << "\n";
            exit(1);
        }
        std::cout << "* " << (int)apis[i] << " '" << name << "': '" << displayName << "'\n";
    }

    // ensure unknown APIs return the empty string
    {
        const char *s = rtmidi_api_name((RtMidiApi)-1);
        const std::string name(s?s:"");
        if (!name.empty()) {
            std::cout << "Bad string for invalid API '" << name << "'\n";
            exit(1);
        }
        s = rtmidi_api_display_name((RtMidiApi)-1);
        const std::string displayName(s?s:"");
        if (displayName!="Unknown") {
            std::cout << "Bad display string for invalid API '" << displayName << "'\n";
            exit(1);
        }
    }

    // try getting API identifier by name
    std::cout << "API identifiers by name (C):\n";
    for ( size_t i = 0; i < api_count ; ++i ) {
        const char *s = rtmidi_api_name(apis[i]);
        std::string name(s?s:"");
        if ( rtmidi_compiled_api_by_name(name.c_str()) != apis[i] ) {
            std::cout << "Bad identifier for API '" << name << "'\n";
            exit( 1 );
        }
        std::cout << "* '" << name << "': " << (int)apis[i] << "\n";

        for ( size_t j = 0; j < name.size(); ++j )
            name[j] = (j & 1) ? toupper(name[j]) : tolower(name[j]);
        RtMidiApi api = rtmidi_compiled_api_by_name(name.c_str());
        if ( api != RTMIDI_API_UNSPECIFIED ) {
            std::cout << "Identifier " << (int)api << " for invalid API '" << name << "'\n";
            exit( 1 );
        }
    }

    // try getting an API identifier by unknown name
    {
        RtMidiApi api;
        api = rtmidi_compiled_api_by_name("");
        if ( api != RTMIDI_API_UNSPECIFIED ) {
            std::cout << "Bad identifier for unknown API name\n";
            exit( 1 );
        }
    }

    return 0;
}